

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O3

int __thiscall kstream<gzFile_s_*,_FunctorZlib>::getHeader(kstream<gzFile_s_*,_FunctorZlib> *this)

{
  int iVar1;
  FILE *in_RSI;
  
  while ((iVar1 = getc(this,in_RSI), iVar1 != 0x40 && (iVar1 != 0x3e))) {
    if (iVar1 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR: The file appears to be empty",0x23);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      return -1;
    }
  }
  this->begin = this->begin + -1;
  return 10;
}

Assistant:

int getHeader() {
        int c;
        while ((c = this->getc()) != -1 && c != '>' && c != '@');
        if (c == -1) {
            std::cerr << "ERROR: The file appears to be empty" << std::endl;
            return -1;
        }
        if (c == int('>') || c == int('@')){
            begin--;
            c = int('\n');
        }
        return c;
    }